

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O0

void __thiscall leveldb::BloomTest::Build(BloomTest *this)

{
  FilterPolicy *pFVar1;
  ulong uVar2;
  size_type sVar3;
  reference s;
  reference pvVar4;
  Slice local_40;
  ulong local_30;
  size_t i;
  vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> key_slices;
  BloomTest *this_local;
  
  key_slices.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::vector
            ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)&i);
  local_30 = 0;
  while( true ) {
    uVar2 = local_30;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->keys_);
    if (sVar3 <= uVar2) break;
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->keys_,local_30);
    Slice::Slice(&local_40,s);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::push_back
              ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)&i,&local_40);
    local_30 = local_30 + 1;
  }
  std::__cxx11::string::clear();
  pFVar1 = this->policy_;
  pvVar4 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::operator[]
                     ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)&i,0);
  sVar3 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::size
                    ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)&i);
  (*pFVar1->_vptr_FilterPolicy[3])(pFVar1,pvVar4,sVar3 & 0xffffffff,&this->filter_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->keys_);
  std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::~vector
            ((vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> *)&i);
  return;
}

Assistant:

void Build() {
    std::vector<Slice> key_slices;
    for (size_t i = 0; i < keys_.size(); i++) {
      key_slices.push_back(Slice(keys_[i]));
    }
    filter_.clear();
    policy_->CreateFilter(&key_slices[0], static_cast<int>(key_slices.size()),
                          &filter_);
    keys_.clear();
    if (kVerbose >= 2) DumpFilter();
  }